

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

char * make_signed_hex_str_8(uint val)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  char *__format;
  
  if ((char)val < '\0') {
    uVar2 = -val & 0x7f;
    __format = "-$%x";
  }
  else {
    uVar2 = val & 0x7f;
    __format = "$%x";
  }
  iVar1 = sprintf(make_signed_hex_str_8::str,__format,(ulong)uVar2);
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

static char* make_signed_hex_str_8(uint val)
{
	static char str[20];

	val &= 0xff;

	if(val == 0x80)
		sprintf(str, "-$80");
	else if(val & 0x80)
		sprintf(str, "-$%x", (0-val) & 0x7f);
	else
		sprintf(str, "$%x", val & 0x7f);

	return str;
}